

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageQueue.hpp
# Opt level: O0

void __thiscall
mq::
DerivedQueue<(anonymous_namespace)::Action,_std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>_>
::pop_front(DerivedQueue<(anonymous_namespace)::Action,_std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>_>
            *this)

{
  DerivedQueue<(anonymous_namespace)::Action,_std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>_>
  *this_local;
  
  std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::
  pop_front(&this->queue);
  return;
}

Assistant:

void pop_front() final { queue.pop_front(); }